

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

SPIRString * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRString>::allocate<spirv_cross::SPIRString&>
          (ObjectPool<spirv_cross::SPIRString> *this,SPIRString *p)

{
  size_t sVar1;
  pointer pcVar2;
  _Tuple_impl<0UL,_spirv_cross::SPIRString_*,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>
  _Var3;
  ulong uVar4;
  uint uVar5;
  _Head_base<0UL,_spirv_cross::SPIRString_*,_false> _Var6;
  SPIRString *pSVar7;
  
  if ((this->vacants).super_VectorView<spirv_cross::SPIRString_*>.buffer_size == 0) {
    uVar5 = this->start_object_count <<
            ((byte)(this->memory).
                   super_VectorView<std::unique_ptr<spirv_cross::SPIRString,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>_>
                   .buffer_size & 0x1f);
    uVar4 = (ulong)uVar5;
    _Var3.super__Head_base<0UL,_spirv_cross::SPIRString_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRString_*,_false>)malloc(uVar4 * 0x30);
    if (_Var3.super__Head_base<0UL,_spirv_cross::SPIRString_*,_false>._M_head_impl !=
        (SPIRString *)0x0) {
      _Var6._M_head_impl =
           (SPIRString *)_Var3.super__Head_base<0UL,_spirv_cross::SPIRString_*,_false>._M_head_impl;
      if (uVar5 != 0) {
        do {
          SmallVector<spirv_cross::SPIRString_*,_0UL>::reserve
                    (&this->vacants,
                     (this->vacants).super_VectorView<spirv_cross::SPIRString_*>.buffer_size + 1);
          sVar1 = (this->vacants).super_VectorView<spirv_cross::SPIRString_*>.buffer_size;
          (this->vacants).super_VectorView<spirv_cross::SPIRString_*>.ptr[sVar1] =
               _Var6._M_head_impl;
          (this->vacants).super_VectorView<spirv_cross::SPIRString_*>.buffer_size = sVar1 + 1;
          uVar4 = uVar4 - 1;
          _Var6._M_head_impl = _Var6._M_head_impl + 1;
        } while (uVar4 != 0);
      }
      SmallVector<std::unique_ptr<spirv_cross::SPIRString,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>,_8UL>
      ::reserve(&this->memory,
                (this->memory).
                super_VectorView<std::unique_ptr<spirv_cross::SPIRString,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>_>
                .buffer_size + 1);
      sVar1 = (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRString,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>_>
              .buffer_size;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRString,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>_>
      .ptr[sVar1]._M_t.
      super___uniq_ptr_impl<spirv_cross::SPIRString,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_spirv_cross::SPIRString_*,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>
      .super__Head_base<0UL,_spirv_cross::SPIRString_*,_false> =
           _Var3.super__Head_base<0UL,_spirv_cross::SPIRString_*,_false>._M_head_impl;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRString,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>_>
      .buffer_size = sVar1 + 1;
      if (_Var3.super__Head_base<0UL,_spirv_cross::SPIRString_*,_false>._M_head_impl !=
          (SPIRString *)0x0) goto LAB_002cd0a0;
    }
    pSVar7 = (SPIRString *)0x0;
  }
  else {
LAB_002cd0a0:
    sVar1 = (this->vacants).super_VectorView<spirv_cross::SPIRString_*>.buffer_size;
    pSVar7 = (this->vacants).super_VectorView<spirv_cross::SPIRString_*>.ptr[sVar1 - 1];
    if (sVar1 != 0) {
      SmallVector<spirv_cross::SPIRString_*,_0UL>::resize(&this->vacants,sVar1 - 1);
    }
    (pSVar7->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__IVariant_0035b498;
    (pSVar7->super_IVariant).self.id = (p->super_IVariant).self.id;
    (pSVar7->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRString_0035c890;
    (pSVar7->str)._M_dataplus._M_p = (pointer)&(pSVar7->str).field_2;
    pcVar2 = (p->str)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&pSVar7->str,pcVar2,pcVar2 + (p->str)._M_string_length);
  }
  return pSVar7;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}